

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_result ma_fader_init(ma_fader_config *pConfig,ma_fader *pFader)

{
  ma_uint32 mVar1;
  ma_result mVar2;
  
  mVar2 = MA_INVALID_ARGS;
  if (pFader != (ma_fader *)0x0) {
    *(undefined8 *)&pFader->volumeEnd = 0;
    pFader->lengthInFrames = 0;
    (pFader->config).format = ma_format_unknown;
    (pFader->config).channels = 0;
    *(undefined8 *)&(pFader->config).sampleRate = 0;
    pFader->cursorInFrames = 0;
    if ((pConfig != (ma_fader_config *)0x0) && (pConfig->format == ma_format_f32)) {
      (pFader->config).sampleRate = pConfig->sampleRate;
      mVar1 = pConfig->channels;
      (pFader->config).format = pConfig->format;
      (pFader->config).channels = mVar1;
      pFader->volumeBeg = 1.0;
      pFader->volumeEnd = 1.0;
      pFader->lengthInFrames = 0;
      pFader->cursorInFrames = 0;
      mVar2 = MA_SUCCESS;
    }
  }
  return mVar2;
}

Assistant:

MA_API ma_result ma_fader_init(const ma_fader_config* pConfig, ma_fader* pFader)
{
    if (pFader == NULL) {
        return MA_INVALID_ARGS;
    }

    MA_ZERO_OBJECT(pFader);

    if (pConfig == NULL) {
        return MA_INVALID_ARGS;
    }

    /* Only f32 is supported for now. */
    if (pConfig->format != ma_format_f32) {
        return MA_INVALID_ARGS;
    }

    pFader->config         = *pConfig;
    pFader->volumeBeg      = 1;
    pFader->volumeEnd      = 1;
    pFader->lengthInFrames = 0;
    pFader->cursorInFrames = 0;

    return MA_SUCCESS;
}